

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O2

int list_first(ListNode *head,ListNode **output)

{
  int iVar1;
  
  _assert_true((unsigned_long)head,"head",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/build_O2/_deps/cmocka-src/src/cmocka.c"
               ,699);
  iVar1 = list_empty(head);
  if (iVar1 == 0) {
    *output = head->next;
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int list_first(ListNode * const head, ListNode **output) {
    ListNode *target_node = NULL;
    assert_non_null(head);
    if (list_empty(head)) {
        return 0;
    }
    target_node = head->next;
    *output = target_node;
    return 1;
}